

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

void deqp::gls::setUniformValue
               (Functions *gl,vector<unsigned_int,_std::allocator<unsigned_int>_> *pipelinePrograms,
               string *name,Value *val,int arrayNdx,TestLog *log)

{
  ostringstream *this;
  DataType dataType;
  bool bVar1;
  int iVar2;
  GLint GVar3;
  int programNdx;
  long lVar4;
  MessageBuilder local_1b0;
  
  bVar1 = false;
  for (lVar4 = 0;
      lVar4 < (int)((ulong)((long)(pipelinePrograms->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pipelinePrograms->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); lVar4 = lVar4 + 1)
  {
    dataType = (val->type).m_data.basic.type;
    iVar2 = glu::getDataTypeScalarSize(dataType);
    GVar3 = (*gl->getUniformLocation)
                      ((pipelinePrograms->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar4],(name->_M_dataplus)._M_p);
    if (GVar3 != -1) {
      (*gl->useProgram)((pipelinePrograms->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar4]);
      bVar1 = true;
      if (dataType - TYPE_FLOAT < 0x26) {
        iVar2 = iVar2 * arrayNdx;
        switch(dataType) {
        case TYPE_FLOAT:
          (*gl->uniform1fv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_VEC2:
          (*gl->uniform2fv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_VEC3:
          (*gl->uniform3fv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_VEC4:
          (*gl->uniform4fv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT2:
          (*gl->uniformMatrix2fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT2X3:
          (*gl->uniformMatrix2x3fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT2X4:
          (*gl->uniformMatrix2x4fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT3X2:
          (*gl->uniformMatrix3x2fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT3:
          (*gl->uniformMatrix3fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT3X4:
          (*gl->uniformMatrix3x4fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT4X2:
          (*gl->uniformMatrix4x2fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT4X3:
          (*gl->uniformMatrix4x3fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_FLOAT_MAT4:
          (*gl->uniformMatrix4fv)
                    (GVar3,1,'\0',
                     &(val->elements).
                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].float32);
          break;
        case TYPE_INT:
        case TYPE_BOOL:
          (*gl->uniform1iv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_INT_VEC2:
        case TYPE_BOOL_VEC2:
          (*gl->uniform2iv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_INT_VEC3:
        case TYPE_BOOL_VEC3:
          (*gl->uniform3iv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_INT_VEC4:
        case TYPE_BOOL_VEC4:
          (*gl->uniform4iv)(GVar3,1,&(val->elements).
                                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_UINT:
          (*gl->uniform1uiv)(GVar3,1,(GLuint *)
                                     &(val->elements).
                                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_UINT_VEC2:
          (*gl->uniform2uiv)(GVar3,1,(GLuint *)
                                     &(val->elements).
                                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_UINT_VEC3:
          (*gl->uniform3uiv)(GVar3,1,(GLuint *)
                                     &(val->elements).
                                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
          break;
        case TYPE_UINT_VEC4:
          (*gl->uniform4uiv)(GVar3,1,(GLuint *)
                                     &(val->elements).
                                      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar2].int32);
        }
      }
    }
  }
  if (!bVar1) {
    this = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"WARNING // Uniform \"");
    std::operator<<((ostream *)this,(string *)name);
    std::operator<<((ostream *)this,
                    "\" location is not valid, location = -1. Cannot set value to the uniform.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  return;
}

Assistant:

static void setUniformValue (const glw::Functions& gl, const std::vector<deUint32>& pipelinePrograms, const std::string& name, const Value& val, int arrayNdx, tcu::TestLog& log)
{
	bool foundAnyMatch = false;

	for (int programNdx = 0; programNdx < (int)pipelinePrograms.size(); ++programNdx)
	{
		const DataType	dataType	= val.type.getBasicType();
		const int		scalarSize	= getDataTypeScalarSize(dataType);
		const int		loc			= gl.getUniformLocation(pipelinePrograms[programNdx], name.c_str());
		const int		elemNdx		= arrayNdx * scalarSize;

		DE_ASSERT(elemNdx+scalarSize <= (int)val.elements.size());

		if (loc == -1)
			continue;

		foundAnyMatch = true;

		DE_STATIC_ASSERT(sizeof(Value::Element) == sizeof(glw::GLfloat));
		DE_STATIC_ASSERT(sizeof(Value::Element) == sizeof(glw::GLint));

		gl.useProgram(pipelinePrograms[programNdx]);

		switch (dataType)
		{
			case TYPE_FLOAT:		gl.uniform1fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_INT:			gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC2:		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC3:		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC4:		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL:			gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC2:	gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC3:	gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC4:	gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_UINT:			gl.uniform1uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC2:	gl.uniform2uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC3:	gl.uniform3uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC4:	gl.uniform4uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;

			case TYPE_SAMPLER_2D:
			case TYPE_SAMPLER_CUBE:
				DE_FATAL("implement!");
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (!foundAnyMatch)
		log << tcu::TestLog::Message << "WARNING // Uniform \"" << name << "\" location is not valid, location = -1. Cannot set value to the uniform." << tcu::TestLog::EndMessage;
}